

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatc.cpp
# Opt level: O2

string * __thiscall
flatbuffers::FlatCompiler::GetShortUsageString
          (string *__return_storage_ptr__,FlatCompiler *this,string *program_name)

{
  ostream *poVar1;
  _Rb_tree_node_base *p_Var2;
  size_t in_RCX;
  long lVar3;
  string help;
  stringstream ss;
  ostream local_330 [376];
  stringstream ss_textwrap;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar1 = std::operator<<(local_330,"Usage: ");
  poVar1 = std::operator<<(poVar1,(string *)program_name);
  std::operator<<(poVar1," [");
  for (p_Var2 = (_Rb_tree_node_base *)language_options._24_8_;
      p_Var2 != (_Rb_tree_node_base *)(language_options + 8);
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    AppendShortOption(&ss,(FlatCOption *)(p_Var2 + 1));
    std::operator<<(local_330,", ");
  }
  for (lVar3 = 0; lVar3 != 0x2d00; lVar3 = lVar3 + 0x80) {
    AppendShortOption(&ss,(FlatCOption *)(flatc_options + lVar3));
    std::operator<<(local_330,", ");
  }
  std::ostream::seekp((long)local_330,~_S_cur);
  std::operator<<(local_330,"]... FILE... [-- BINARY_FILE...]");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::stringstream((stringstream *)&ss_textwrap);
  AppendTextWrappedString(&ss_textwrap,&help,0,in_RCX);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss_textwrap);
  std::__cxx11::string::~string((string *)&help);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string FlatCompiler::GetShortUsageString(
    const std::string &program_name) const {
  std::stringstream ss;
  ss << "Usage: " << program_name << " [";

  for (const FlatCOption &option : language_options) {
    AppendShortOption(ss, option);
    ss << ", ";
  }

  for (const FlatCOption &option : flatc_options) {
    AppendShortOption(ss, option);
    ss << ", ";
  }

  ss.seekp(-2, ss.cur);
  ss << "]... FILE... [-- BINARY_FILE...]";
  std::string help = ss.str();
  std::stringstream ss_textwrap;
  AppendTextWrappedString(ss_textwrap, help, 80, 0);
  return ss_textwrap.str();
}